

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsException.h
# Opt level: O2

void __thiscall AdsException::~AdsException(AdsException *this)

{
  ~AdsException(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AdsException() throw (){}